

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
          (TOIFactoredRewardDecPOMDPDiscrete *this,string *name,string *descr,string *pf,
          bool cacheFlatModels)

{
  byte bVar1;
  string *in_RCX;
  void **in_RDX;
  TOIDecPOMDPDiscrete *in_RSI;
  undefined8 *in_RDI;
  DecPOMDPDiscreteInterface *this_00;
  byte in_R8B;
  undefined1 in_stack_ffffffffffffffcf;
  string *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  this_00 = (DecPOMDPDiscreteInterface *)(in_RDI + 0x5b);
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  POSGInterface::POSGInterface((POSGInterface *)this_00,&PTR_PTR_00d3bba0);
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_00d3bb88);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0x5c),
             &PTR_construction_vtable_384__00d3bbb0);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            (this_00,&PTR_construction_vtable_232__00d3bb60);
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (in_RSI,in_RDX,in_RCX,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  *in_RDI = 0xd3b2f8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5b] = 0xd3b6d8;
  in_RDI[0x5c] = 0xd3b930;
  in_RDI[0x50] = 0xd3b550;
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::vector
            ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)0xac8657);
  *(undefined1 *)(in_RDI + 0x57) = 0;
  return;
}

Assistant:

TOIFactoredRewardDecPOMDPDiscrete::
TOIFactoredRewardDecPOMDPDiscrete(
    const string &name, const string &descr, const string &pf,
    bool cacheFlatModels) :
    TOIDecPOMDPDiscrete(name, descr, pf, cacheFlatModels)
{
    _m_initialized = false;
}